

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_variable_id spvc_compiler_hlsl_remap_num_workgroups_builtin(spvc_compiler compiler)

{
  spvc_context_s *this;
  uint32_t local_5c;
  CompilerHLSL *local_58;
  CompilerHLSL *hlsl;
  allocator local_39;
  string local_38;
  spvc_compiler local_18;
  spvc_compiler compiler_local;
  
  local_18 = compiler;
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    local_58 = (CompilerHLSL *)
               std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
               get(&compiler->compiler);
    local_5c = (uint32_t)spirv_cross::CompilerHLSL::remap_num_workgroups_builtin(local_58);
    compiler_local._4_4_ = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)&local_5c)
    ;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"HLSL function used on a non-HLSL backend.",&local_39);
    spvc_context_s::report_error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    compiler_local._4_4_ = 0;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_variable_id spvc_compiler_hlsl_remap_num_workgroups_builtin(spvc_compiler compiler)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return 0;
	}

	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	return hlsl.remap_num_workgroups_builtin();
#else
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return 0;
#endif
}